

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV3MeshNormalListBlock(Parser *this,Mesh *sMesh)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  byte bVar1;
  char *pcVar2;
  pointer paVar3;
  pointer pFVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Logger *pLVar9;
  ulong uVar10;
  char *pcVar11;
  aiVector3D vNormal;
  uint index;
  uint faceIdx;
  value_type local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  
  this_00 = &(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (this_00,((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x2e8ba2e8ba2e8ba3,
             &local_48);
  local_38 = 0xffffffff;
  local_34 = 0;
LAB_003e542b:
  do {
    while( true ) {
      uVar7 = local_38;
      pcVar2 = this->filePtr;
      if (*pcVar2 != '*') goto LAB_003e5671;
      this->filePtr = pcVar2 + 1;
      uVar8 = (ulong)local_38;
      if (uVar8 != 0xffffffff) break;
LAB_003e5464:
      pcVar2 = this->filePtr;
      iVar6 = strncmp("MESH_FACENORMAL",pcVar2,0xf);
      if (iVar6 == 0) {
        bVar1 = pcVar2[0xf];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        goto LAB_003e5671;
        pcVar11 = pcVar2 + 0x10;
        if (bVar1 == 0) {
          pcVar11 = pcVar2 + 0xf;
        }
        this->filePtr = pcVar11;
        local_48.x = 0.0;
        local_48.y = 0.0;
        local_48.z = 0.0;
        ParseLV4MeshFloatTriple(this,&local_48.x,&local_38);
        uVar8 = (ulong)local_38;
        uVar10 = ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * 0xf83e0f83e0f83e1;
        if (uVar8 <= uVar10 && uVar10 - uVar8 != 0) {
          uVar7 = local_38 * 3;
          paVar3 = (this_00->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar3[uVar7].x = local_48.x + paVar3[uVar7].x;
          paVar3[uVar7].y = local_48.y + paVar3[uVar7].y;
          paVar3[uVar7].z = local_48.z + paVar3[uVar7].z;
          uVar8 = uVar8 * 3 + 1 & 0xffffffff;
          paVar3 = (this_00->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar3[uVar8].x = local_48.x + paVar3[uVar8].x;
          paVar3[uVar8].y = local_48.y + paVar3[uVar8].y;
          paVar3[uVar8].z = local_48.z + paVar3[uVar8].z;
          uVar7 = local_38 * 3 + 2;
          goto LAB_003e557f;
        }
        pLVar9 = DefaultLogger::get();
        Logger::error(pLVar9,"ASE: Invalid vertex index in MESH_FACENORMAL section");
      }
      else {
LAB_003e5671:
        pbVar5 = (byte *)this->filePtr;
        bVar1 = *pbVar5;
        uVar7 = (uint)bVar1;
        if (bVar1 == 0x7b) {
          local_34 = local_34 + 1;
        }
        else if (bVar1 == 0x7d) {
          local_34 = local_34 + -1;
          if (local_34 == 0) {
            this->filePtr = (char *)(pbVar5 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else if (uVar7 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a *MESH_NORMALS chunk (Level 3)");
        }
        if (((uVar7 < 0xe) && ((0x3401U >> (uVar7 & 0x1f) & 1) != 0)) &&
           (this->bLastWasEndLine == false)) {
          this->iLineNumber = this->iLineNumber + 1;
          this->bLastWasEndLine = true;
        }
        else {
          this->bLastWasEndLine = false;
        }
        this->filePtr = (char *)(pbVar5 + 1);
      }
    }
    iVar6 = strncmp("MESH_VERTEXNORMAL",pcVar2 + 1,0x11);
    if (iVar6 != 0) goto LAB_003e5464;
    bVar1 = pcVar2[0x12];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_003e5464;
    pcVar11 = pcVar2 + 0x13;
    if (bVar1 == 0) {
      pcVar11 = pcVar2 + 0x12;
    }
    this->filePtr = pcVar11;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    ParseLV4MeshFloatTriple(this,&local_48.x,&local_3c);
    pFVar4 = (sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(sMesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                    super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 2) *
             0xf83e0f83e0f83e1;
  } while (uVar10 < uVar8 || uVar10 - uVar8 == 0);
  if (local_3c == pFVar4[uVar8].super_FaceWithSmoothingGroup.mIndices[0]) {
    local_3c = 0;
  }
  else if (local_3c == pFVar4[uVar8].super_FaceWithSmoothingGroup.mIndices[1]) {
    local_3c = 1;
  }
  else {
    if (local_3c != pFVar4[uVar8].super_FaceWithSmoothingGroup.mIndices[2]) {
      pLVar9 = DefaultLogger::get();
      Logger::error(pLVar9,"ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
      goto LAB_003e542b;
    }
    local_3c = 2;
  }
  uVar7 = uVar7 * 3 + local_3c;
LAB_003e557f:
  paVar3 = (this_00->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar3[uVar7].x = local_48.x + paVar3[uVar7].x;
  paVar3[uVar7].y = local_48.y + paVar3[uVar7].y;
  paVar3[uVar7].z = local_48.z + paVar3[uVar7].z;
  goto LAB_003e542b;
}

Assistant:

void Parser::ParseLV3MeshNormalListBlock(ASE::Mesh& sMesh)
{
    AI_ASE_PARSER_INIT();

    // Allocate enough storage for the normals
    sMesh.mNormals.resize(sMesh.mFaces.size()*3,aiVector3D( 0.f, 0.f, 0.f ));
    unsigned int index, faceIdx = UINT_MAX;

    // FIXME: rewrite this and find out how to interpret the normals
    // correctly. This is crap.

    // Smooth the vertex and face normals together. The result
    // will be edgy then, but otherwise everything would be soft ...
    while (true)    {
        if ('*' == *filePtr)    {
            ++filePtr;
            if (faceIdx != UINT_MAX && TokenMatch(filePtr,"MESH_VERTEXNORMAL",17))  {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,index);
                if (faceIdx >=  sMesh.mFaces.size())
                    continue;

                // Make sure we assign it to the correct face
                const ASE::Face& face = sMesh.mFaces[faceIdx];
                if (index == face.mIndices[0])
                    index = 0;
                else if (index == face.mIndices[1])
                    index = 1;
                else if (index == face.mIndices[2])
                    index = 2;
                else    {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_VERTEXNORMAL section");
                    continue;
                }
                // We'll renormalize later
                sMesh.mNormals[faceIdx*3+index] += vNormal;
                continue;
            }
            if (TokenMatch(filePtr,"MESH_FACENORMAL",15))   {
                aiVector3D vNormal;
                ParseLV4MeshFloatTriple(&vNormal.x,faceIdx);

                if (faceIdx >= sMesh.mFaces.size()) {
                    ASSIMP_LOG_ERROR("ASE: Invalid vertex index in MESH_FACENORMAL section");
                    continue;
                }

                // We'll renormalize later
                sMesh.mNormals[faceIdx*3] += vNormal;
                sMesh.mNormals[faceIdx*3+1] += vNormal;
                sMesh.mNormals[faceIdx*3+2] += vNormal;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_NORMALS");
    }
    return;
}